

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::MinMaxTest_CompareReference_Test::~MinMaxTest_CompareReference_Test
          (MinMaxTest_CompareReference_Test *this)

{
  MinMaxTest_CompareReference_Test *in_stack_00000010;
  
  anon_unknown.dwarf_13161f6::MinMaxTest_CompareReference_Test::~MinMaxTest_CompareReference_Test
            (in_stack_00000010);
  return;
}

Assistant:

TEST_P(MinMaxTest, CompareReference) {
  uint8_t a[64], b[64];
  for (int j = 0; j < 64; j++) {
    a[j] = rnd_.Rand8();
    b[j] = rnd_.Rand8();
  }

  int min_ref, max_ref, min, max;
  reference_minmax(a, 8, b, 8, &min_ref, &max_ref);
  API_REGISTER_STATE_CHECK(mm_func_(a, 8, b, 8, &min, &max));
  EXPECT_EQ(max_ref, max);
  EXPECT_EQ(min_ref, min);
}